

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_net.cpp
# Opt level: O1

void __thiscall Net::learn(Net *this,int global_iterations)

{
  undefined8 *puVar1;
  pointer pvVar2;
  pointer pdVar3;
  pointer pdVar4;
  iterator iVar5;
  long lVar6;
  ulong uVar7;
  pointer pvVar8;
  ostream *poVar9;
  int iVar10;
  pointer piVar11;
  int *piVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  double dVar18;
  undefined1 auVar19 [16];
  vector<double,_std::allocator<double>_> y;
  vector<int,_std::allocator<int>_> cur_shuffle;
  double divisor;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  derivative;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  bias_derivative;
  vector<double,_std::allocator<double>_> local_168;
  vector<double,_std::allocator<double>_> local_148;
  int *local_128;
  iterator iStack_120;
  int *local_118;
  int local_104;
  ulong local_100;
  double local_f8;
  int local_f0;
  int local_ec;
  Table *local_e8;
  double local_e0;
  double local_d8;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  local_d0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_b8;
  double local_a0;
  double local_98;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  *local_90;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_88;
  Table *local_80;
  vector<double,_std::allocator<double>_> local_78;
  vector<double,_std::allocator<double>_> local_60;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_48;
  
  if (0 < global_iterations) {
    local_88 = &this->init_biases;
    local_90 = &this->init;
    local_80 = &this->samples;
    local_e8 = &this->answers;
    local_a0 = (double)global_iterations;
    local_100 = 1;
    local_104 = global_iterations;
    do {
      lVar6 = (long)(this->shuffler).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->shuffler).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
      if (lVar6 != 0) {
        uVar7 = lVar6 >> 2;
        iVar14 = (int)(local_100 / 0x32);
        local_f0 = (int)local_100 + iVar14 * -0x32;
        local_98 = (double)(int)local_100 / local_a0;
        local_f8 = (double)CONCAT44(local_f8._4_4_,
                                    (int)CONCAT71((uint7)(uint3)((uint)(iVar14 * 0x32) >> 8),1));
        iVar14 = 0;
        do {
          local_128 = (int *)0x0;
          iStack_120._M_current = (int *)0x0;
          local_118 = (int *)0x0;
          lVar6 = (long)iVar14;
          if (uVar7 < (ulong)(this->shot + lVar6)) {
            uVar7 = (ulong)iVar14;
            piVar11 = (this->shuffler).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (uVar7 < (ulong)((long)(this->shuffler).super__Vector_base<int,_std::allocator<int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)piVar11 >>
                               2)) {
              lVar6 = uVar7 * 4;
              do {
                if (iStack_120._M_current == local_118) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&local_128,iStack_120,
                             (int *)((long)piVar11 + lVar6));
                }
                else {
                  *iStack_120._M_current = *(int *)((long)piVar11 + lVar6);
                  iStack_120._M_current = iStack_120._M_current + 1;
                }
                uVar7 = uVar7 + 1;
                piVar11 = (this->shuffler).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                lVar6 = lVar6 + 4;
              } while (uVar7 < (ulong)((long)(this->shuffler).
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_finish - (long)piVar11 >> 2)
                      );
              iVar14 = (int)uVar7;
            }
          }
          else if (this->shot < 1) {
            iVar14 = iVar14 + this->shot;
          }
          else {
            lVar16 = lVar6 * 4;
            do {
              piVar12 = (int *)((long)(this->shuffler).super__Vector_base<int,_std::allocator<int>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar16);
              if (iStack_120._M_current == local_118) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_128,iStack_120,piVar12);
              }
              else {
                *iStack_120._M_current = *piVar12;
                iStack_120._M_current = iStack_120._M_current + 1;
              }
              lVar6 = lVar6 + 1;
              lVar15 = (long)iVar14 + (long)this->shot;
              lVar16 = lVar16 + 4;
            } while (lVar6 < lVar15);
            iVar14 = (int)lVar15;
          }
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::vector(&local_b8,local_88);
          std::
          vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
          ::vector(&local_d0,local_90);
          iVar5._M_current = iStack_120._M_current;
          local_ec = iVar14;
          for (piVar12 = local_128; piVar12 != iVar5._M_current; piVar12 = piVar12 + 1) {
            iVar14 = *piVar12;
            pvVar8 = (this->mesh).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (*(pointer *)
                 ((long)&(pvVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + 8) !=
                (pvVar8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start) {
              uVar7 = 0;
              do {
                dVar18 = Table::get_value(local_80,(int)uVar7,iVar14);
                pvVar8 = (this->mesh).
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                lVar6 = *(long *)&(pvVar8->super__Vector_base<double,_std::allocator<double>_>).
                                  _M_impl.super__Vector_impl_data;
                *(double *)(lVar6 + uVar7 * 8) = dVar18;
                uVar7 = uVar7 + 1;
              } while (uVar7 < (ulong)((long)*(pointer *)
                                              ((long)&(pvVar8->
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  )._M_impl.super__Vector_impl_data + 8) - lVar6 >>
                                      3));
            }
            pvVar8 = (this->mesh).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if (1 < (int)((ulong)((long)pvVar8 -
                                 (long)(this->mesh).
                                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                    -0x55555555) {
              iVar13 = 1;
              do {
                propagate_front(this,iVar13);
                pvVar8 = (this->mesh).
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                iVar13 = iVar13 + 1;
                iVar10 = (int)((ulong)((long)pvVar8 -
                                      (long)(this->mesh).
                                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3);
              } while (SBORROW4(iVar13,iVar10 * -0x55555555) != iVar13 + iVar10 * 0x55555555 < 0);
            }
            local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            std::vector<double,_std::allocator<double>_>::vector
                      (&local_168,
                       (long)pvVar8[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)pvVar8[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start >> 3,
                       (value_type_conflict2 *)&local_148,(allocator_type *)&local_d8);
            if (this->function_type == TANH) {
              pvVar8 = (this->mesh).
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0xbff0000000000000;
              std::vector<double,_std::allocator<double>_>::_M_fill_assign
                        (&local_168,
                         (long)pvVar8[-1].super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)pvVar8[-1].super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3,
                         (value_type_conflict2 *)&local_148);
            }
            dVar18 = Table::get_value(local_e8,0,iVar14);
            local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[(int)dVar18] = 1.0;
            iVar14 = (int)((ulong)((long)(this->mesh).
                                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->mesh).
                                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                     -0x55555555;
            if (1 < iVar14) {
              iVar14 = iVar14 + 1;
              do {
                std::vector<double,_std::allocator<double>_>::vector(&local_78,&local_168);
                propagate_back(&local_148,this,iVar14 + -2,&local_78,&local_d0,&local_b8);
                pdVar4 = local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
                pdVar3 = local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start =
                     local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
                local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
                local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                if (pdVar3 != (pointer)0x0) {
                  operator_delete(pdVar3,(long)pdVar4 - (long)pdVar3);
                }
                if (local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_148.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_148.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage -
                                  (long)local_148.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start);
                }
                if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_78.super__Vector_base<double,_std::allocator<double>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_78.super__Vector_base<double,_std::allocator<double>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                iVar14 = iVar14 + -1;
              } while (2 < iVar14);
            }
            if (local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_168.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_168.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
          }
          lVar6 = (long)iStack_120._M_current - (long)local_128 >> 2;
          auVar19._8_4_ = (int)((long)iStack_120._M_current - (long)local_128 >> 0x22);
          auVar19._0_8_ = lVar6;
          auVar19._12_4_ = 0x45300000;
          local_d8 = 1.0 / ((auVar19._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0));
          if (1 < (int)((ulong)((long)(this->mesh).
                                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->mesh).
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555)
          {
            lVar6 = 1;
            lVar16 = 0x18;
            do {
              mult_matrix_on_constant<double>
                        (&local_48,
                         (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          *)((long)&((local_d0.
                                      super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + lVar16),&local_d8);
              std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::~vector(&local_48);
              mult_matrix_on_constant<double>
                        (&local_60,
                         (vector<double,_std::allocator<double>_> *)
                         ((long)&((local_b8.
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                 super__Vector_impl_data._M_start + lVar16),&local_d8);
              if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start,
                                (long)local_60.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_60.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              local_e0 = -1.0;
              mult_matrix_on_constant<double>
                        ((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          *)&local_148,
                         (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          *)((long)&((local_d0.
                                      super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + lVar16),&local_e0);
              local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start =
                   *(pointer *)
                    ((long)&((local_d0.
                              super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + lVar16);
              puVar1 = (undefined8 *)
                       ((long)&((local_d0.
                                 super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish + lVar16);
              local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)*puVar1;
              local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)puVar1[1];
              *(pointer *)
               ((long)&((local_d0.
                         super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + lVar16) =
                   local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
              *(pointer *)
               ((long)&((local_d0.
                         super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish + lVar16) =
                   local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              *(pointer *)
               ((long)&((local_d0.
                         super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_end_of_storage + lVar16) =
                   local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)&local_168);
              std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)&local_148);
              local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0xbff0000000000000;
              mult_matrix_on_constant<double>
                        (&local_168,
                         (vector<double,_std::allocator<double>_> *)
                         ((long)&((local_b8.
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                 super__Vector_impl_data._M_start + lVar16),(double *)&local_148);
              std::vector<double,_std::allocator<double>_>::_M_move_assign
                        ((vector<double,_std::allocator<double>_> *)
                         ((long)&((local_b8.
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                 super__Vector_impl_data._M_start + lVar16),&local_168);
              if (local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_168.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_168.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_168.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              add_matrix<double>((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  *)&local_148,
                                 (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  *)((long)&(((this->weights).
                                              super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                            )._M_impl.super__Vector_impl_data + lVar16),
                                 (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  *)((long)&((local_d0.
                                              super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + lVar16));
              pvVar2 = (this->weights).
                       super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start =
                   *(pointer *)
                    ((long)&(pvVar2->
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            )._M_impl.super__Vector_impl_data + lVar16);
              puVar1 = (undefined8 *)
                       ((long)&(pvVar2->
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               )._M_impl.super__Vector_impl_data + lVar16 + 8);
              local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)*puVar1;
              local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)puVar1[1];
              *(pointer *)
               ((long)&(pvVar2->
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       )._M_impl.super__Vector_impl_data + lVar16) =
                   local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
              *(pointer *)
               ((long)&(pvVar2->
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       )._M_impl.super__Vector_impl_data + lVar16 + 8) =
                   local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              *(pointer *)
               ((long)&(pvVar2->
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       )._M_impl.super__Vector_impl_data + lVar16 + 0x10) =
                   local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)&local_168);
              std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)&local_148);
              add_matrix<double>(&local_168,
                                 (vector<double,_std::allocator<double>_> *)
                                 ((long)&(((this->biases).
                                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super__Vector_base<double,_std::allocator<double>_>).
                                         _M_impl.super__Vector_impl_data + lVar16),
                                 (vector<double,_std::allocator<double>_> *)
                                 ((long)&((local_b8.
                                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super__Vector_base<double,_std::allocator<double>_>).
                                         _M_impl.super__Vector_impl_data._M_start + lVar16));
              std::vector<double,_std::allocator<double>_>::_M_move_assign
                        ((vector<double,_std::allocator<double>_> *)
                         ((long)&(((this->biases).
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                 super__Vector_impl_data + lVar16),&local_168);
              if (local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_168.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_168.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_168.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              lVar6 = lVar6 + 1;
              lVar16 = lVar16 + 0x18;
            } while (lVar6 < (int)((ulong)((long)(this->mesh).
                                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(this->mesh).
                                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                             -0x55555555);
          }
          if ((local_f8._0_1_ & local_f0 == 0) != 0) {
            poVar9 = std::ostream::_M_insert<double>(local_98);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"% finished",10);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
            std::ostream::put((char)poVar9);
            std::ostream::flush();
            lVar6 = 0;
            do {
              iVar14 = local_128[lVar6];
              pvVar8 = (this->mesh).
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              std::vector<double,_std::allocator<double>_>::vector
                        (&local_168,
                         (long)pvVar8[-1].super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)pvVar8[-1].super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3,
                         (value_type_conflict2 *)&local_148,(allocator_type *)&local_e0);
              if (this->function_type == TANH) {
                pvVar8 = (this->mesh).
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0xbff0000000000000;
                std::vector<double,_std::allocator<double>_>::_M_fill_assign
                          (&local_168,
                           (long)pvVar8[-1].super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)pvVar8[-1].super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3,
                           (value_type_conflict2 *)&local_148);
              }
              dVar18 = Table::get_value(local_e8,0,iVar14);
              local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[(int)dVar18] = 1.0;
              pvVar8 = (this->mesh).
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              if (1 < (int)((ulong)((long)pvVar8 -
                                   (long)(this->mesh).
                                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                      -0x55555555) {
                iVar14 = 1;
                do {
                  propagate_front(this,iVar14);
                  pvVar8 = (this->mesh).
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  iVar14 = iVar14 + 1;
                  iVar13 = (int)((ulong)((long)pvVar8 -
                                        (long)(this->mesh).
                                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
                } while (SBORROW4(iVar14,iVar13 * -0x55555555) != iVar14 + iVar13 * 0x55555555 < 0);
              }
              pdVar3 = pvVar8[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              lVar16 = (long)pvVar8[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)pdVar3;
              if (lVar16 == 0) {
                local_f8 = 0.0;
              }
              else {
                lVar16 = lVar16 >> 3;
                local_f8 = 0.0;
                lVar15 = 0;
                do {
                  dVar18 = pdVar3[lVar15] -
                           local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar15];
                  local_f8 = local_f8 + dVar18 * dVar18;
                  lVar15 = lVar15 + 1;
                } while (lVar16 + (ulong)(lVar16 == 0) != lVar15);
              }
              poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)local_100);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9," iteration - COST: ",0x13);
              poVar9 = std::ostream::_M_insert<double>(local_f8);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
              std::ostream::put((char)poVar9);
              std::ostream::flush();
              if (local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_168.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_168.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_168.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              bVar17 = lVar6 == 0;
              lVar6 = lVar6 + 1;
            } while (bVar17);
            local_f8 = (double)((ulong)local_f8 & 0xffffffff00000000);
          }
          std::
          vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
          ::~vector(&local_d0);
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::~vector(&local_b8);
          iVar14 = local_ec;
          if (local_128 != (int *)0x0) {
            operator_delete(local_128,(long)local_118 - (long)local_128);
          }
          uVar7 = (long)(this->shuffler).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(this->shuffler).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2;
        } while ((ulong)(long)iVar14 < uVar7);
      }
      iVar14 = (int)local_100;
      local_100 = (ulong)(iVar14 + 1);
    } while (iVar14 != local_104);
  }
  return;
}

Assistant:

void Net::learn(int global_iterations){
    for (int iteration = 1; iteration <= global_iterations; ++iteration) {
        int cur = 0;
        bool ok = true;
        while (cur < shuffler.size()) {
            // get new shuffled data
            std::vector<int> cur_shuffle;
            if (cur + shot > shuffler.size()) {
                for (; cur < shuffler.size(); ++cur)
                    cur_shuffle.push_back(shuffler[cur]);
            } else {
                for (int i = cur; i < cur + shot; ++i)
                    cur_shuffle.push_back(shuffler[i]);
                cur += shot;
            }
            // front propagate each sample
            std::vector<Layer> bias_derivative = init_biases;
            std::vector<std::vector<Layer> > derivative = init;
            for (int i:cur_shuffle) {
                // front propagation
                for (int x = 0; x < mesh[0].size(); ++x)
                    mesh[0][x] = samples.get_value(x, i);
                for (int layer = 1; layer < (int) mesh.size(); ++layer)
                    propagate_front(layer);

                // right answer
                std::vector<double> y(mesh.back().size(), 0);
                if (function_type == TANH)
                    y.assign(mesh.back().size(), -1);
                y[(int) answers.get_value(0, i)] = 1;

//                // counting cost
//                double cost = 0;
//                for (int op = 0; op < mesh.back().size(); ++op)
//                    cost += (mesh.back()[op] - y[op]) * (mesh.back()[op] - y[op]);
//                std::cout << iteration << " iteration - COST: " << cost << std::endl;

                // back_propagation
                for (int layer = (int) mesh.size() - 1; layer >= 1; --layer)
                    y = propagate_back(layer, y, derivative, bias_derivative);
            }
            // get average sum
            double divisor = 1.0 / (double) cur_shuffle.size();
            for (int layer = 1; layer < (int) mesh.size(); ++layer) {
                mult_matrix_on_constant(derivative[layer], divisor);
                mult_matrix_on_constant(bias_derivative[layer], divisor);
                // updating weights

                derivative[layer] = mult_matrix_on_constant(derivative[layer], -1.0);
                bias_derivative[layer] = mult_matrix_on_constant(bias_derivative[layer], -1.);
                weights[layer] = add_matrix(weights[layer], derivative[layer]);
                biases[layer] = add_matrix(biases[layer], bias_derivative[layer]);
//                threshold(biases[layer], MOD);
//                for (int x = 0; x < mesh[layer].size(); ++x)
//                    threshold(weights[layer][x], MOD);
            }

            // learning results
            if (ok && iteration % 50 == 0) {
                ok = false;
                std::cout << (double)iteration / (double)global_iterations << "% finished" << std::endl;
                for (int j = 0; j < 2; ++j) {
                    int i = cur_shuffle[j];
                    std::vector<double> y(mesh.back().size(), 0);
                    if (function_type == TANH)
                        y.assign(mesh.back().size(), -1);
                    y[(int) answers.get_value(0, i)] = 1;
                    for (int layer = 1; layer < (int) mesh.size(); ++layer)
                        propagate_front(layer);
                    double cost = 0;
                    for (int op = 0; op < mesh.back().size(); ++op)
                        cost += (mesh.back()[op] - y[op]) * (mesh.back()[op] - y[op]);
                    std::cout << iteration << " iteration - COST: " << cost << std::endl;
                }
            }
        }
    }
}